

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
find<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,StringPtr *params)

{
  char *pcVar1;
  void *__s2;
  unsigned_long uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  StringPtr *pSVar11;
  char *__s1;
  undefined8 *in_R8;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Maybe<unsigned_long> MVar15;
  Maybe<unsigned_long> MVar16;
  ArrayPtr<const_unsigned_char> s;
  
  MVar16.ptr.field_1.value = table.size_;
  pSVar11 = table.ptr;
  if (pSVar11[1].content.size_ == 0) {
    *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
    MVar16.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar16.ptr;
  }
  s.size_ = in_R8[1] - 1;
  s.ptr = (uchar *)*in_R8;
  uVar5 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  uVar6 = _::chooseBucket((uint)(uVar5 != 0),(uint)pSVar11[1].content.size_);
  pcVar1 = pSVar11[1].content.ptr;
  uVar13 = (ulong)uVar6;
  uVar12 = *(uint *)(pcVar1 + uVar13 * 8 + 4);
  aVar10 = extraout_RDX;
  if (uVar12 != 0) {
    puVar8 = (uint *)(pcVar1 + uVar13 * 8);
    __s2 = (void *)*in_R8;
    uVar2 = in_R8[1];
    uVar3 = pSVar11[1].content.size_;
    do {
      if ((uVar12 != 1) && (*puVar8 == (uint)(uVar5 != 0))) {
        lVar9 = (ulong)(uVar12 - 2) * 0x20;
        lVar4 = *(long *)(MVar16.ptr.field_1.value + 8 + lVar9);
        aVar10.value = lVar4 + (ulong)(lVar4 == 0);
        if (aVar10.value == uVar2) {
          __s1 = "";
          if (lVar4 != 0) {
            __s1 = *(char **)(lVar9 + MVar16.ptr.field_1.value);
          }
          iVar7 = bcmp(__s1,__s2,aVar10.value - 1);
          aVar10 = extraout_RDX_00;
          if (iVar7 == 0) {
            *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
            *(ulong *)(this + 8) = (ulong)(uVar12 - 2);
            goto LAB_0015c3df;
          }
        }
      }
      uVar14 = uVar13 + 1;
      uVar13 = uVar14 & 0xffffffff;
      if (uVar14 == uVar3) {
        uVar13 = 0;
      }
      puVar8 = (uint *)(pcVar1 + uVar13 * 8);
      uVar12 = puVar8[1];
    } while (uVar12 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
LAB_0015c3df:
  MVar15.ptr.field_1.value = aVar10.value;
  MVar15.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar15.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }